

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# notch.hpp
# Opt level: O2

void __thiscall notch::core::Net::clear(Net *this)

{
  __shared_ptr<notch::core::ALossLayer,_(__gnu_cxx::_Lock_policy)2> local_18;
  
  std::
  vector<std::shared_ptr<notch::core::ABackpropLayer>,_std::allocator<std::shared_ptr<notch::core::ABackpropLayer>_>_>
  ::clear(&this->layers);
  local_18._M_ptr = (element_type *)0x0;
  local_18._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  std::__shared_ptr<notch::core::ALossLayer,_(__gnu_cxx::_Lock_policy)2>::operator=
            (&(this->lossLayer).
              super___shared_ptr<notch::core::ALossLayer,_(__gnu_cxx::_Lock_policy)2>,&local_18);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_18._M_refcount);
  return;
}

Assistant:

virtual void clear() {
        layers.clear();
        lossLayer = nullptr;
    }